

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index segment,
          uint32_t offset,uint32_t size)

{
  Result RVar1;
  
  PrintDetails(this,"   - %d: D <%.*s>",index,name.size_ & 0xffffffff,name.data_);
  if ((flags & 0x10) == 0) {
    PrintDetails(this," segment=%u offset=%d size=%d",(ulong)segment,(ulong)offset,(ulong)size);
  }
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnDataSymbol(Index index,
                                         uint32_t flags,
                                         string_view name,
                                         Index segment,
                                         uint32_t offset,
                                         uint32_t size) {
  PrintDetails("   - %d: D <" PRIstringview ">", index,
               WABT_PRINTF_STRING_VIEW_ARG(name));
  if (!(flags & WABT_SYMBOL_FLAG_UNDEFINED))
    PrintDetails(" segment=%" PRIindex " offset=%d size=%d", segment, offset,
                 size);
  return PrintSymbolFlags(flags);
}